

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

golf_movement_t *
golf_movement_linear(golf_movement_t *__return_storage_ptr__,float t0,vec3 p0,vec3 p1,float length)

{
  __return_storage_ptr__->type = GOLF_MOVEMENT_LINEAR;
  __return_storage_ptr__->repeats = true;
  __return_storage_ptr__->t0 = t0;
  __return_storage_ptr__->length = length;
  *(long *)&__return_storage_ptr__->field_4 = p0._0_8_;
  (__return_storage_ptr__->field_4).linear.p0.z = p0.z;
  *(long *)((long)&__return_storage_ptr__->field_4 + 0xc) = p1._0_8_;
  (__return_storage_ptr__->field_4).linear.p1.z = p1.z;
  return __return_storage_ptr__;
}

Assistant:

golf_movement_t golf_movement_linear(float t0, vec3 p0, vec3 p1, float length) {
    golf_movement_t movement;
    movement.type = GOLF_MOVEMENT_LINEAR;
    movement.repeats = true;
    movement.t0 = t0;
    movement.length = length;
    movement.linear.p0 = p0;
    movement.linear.p1 = p1;
    return movement;
}